

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_run_end(JUnitReporter *this,TestRunStats *p)

{
  bool bVar1;
  char *pcVar2;
  string *name;
  XmlWriter *attribute;
  long in_RDI;
  JUnitTestMessage *error;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *__range3_1;
  JUnitTestMessage *failure;
  const_iterator __end3;
  const_iterator __begin3;
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *__range3;
  JUnitTestCase *testCase;
  iterator __end2;
  iterator __begin2;
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
  *__range2;
  string binary_name;
  string *in_stack_fffffffffffffae8;
  XmlWriter *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffaf8;
  allocator *in_stack_fffffffffffffb00;
  allocator *in_stack_fffffffffffffb10;
  XmlWriter *in_stack_fffffffffffffb18;
  XmlWriter *in_stack_fffffffffffffb20;
  allocator *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  XmlWriter *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb78;
  XmlWriter *in_stack_fffffffffffffb80;
  XmlWriter *this_00;
  undefined1 local_3c9 [41];
  string local_3a0 [40];
  reference local_378;
  JUnitTestMessage *local_370;
  __normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
  local_368;
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *local_360;
  allocator local_351;
  double *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  XmlWriter *in_stack_fffffffffffffcc0;
  undefined1 local_329 [41];
  string local_300 [40];
  reference local_2d8;
  JUnitTestMessage *local_2d0;
  __normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
  local_2c8;
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *local_2c0;
  allocator local_2b1;
  string local_2b0 [39];
  undefined1 local_289 [41];
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  undefined1 local_211 [41];
  JUnitTestCase *local_1e8;
  __normal_iterator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>_>
  local_1e0;
  long local_1d8;
  allocator local_1c9;
  string local_1c8 [32];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  String::c_str((String *)0x117817);
  pcVar2 = skipPathFromFilename((char *)in_stack_fffffffffffffaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar2,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"testsuites",&local_69);
  XmlWriter::startElement(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"testsuite",&local_91);
  XmlWriter::startElement(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"name",&local_b9);
  XmlWriter::writeAttribute
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,(string *)in_stack_fffffffffffffb40
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"errors",&local_e1);
  XmlWriter::writeAttribute<int>
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"failures",&local_109);
  XmlWriter::writeAttribute<int>
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"tests",&local_131);
  XmlWriter::writeAttribute<int>
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  if ((*(byte *)(*(long *)(in_RDI + 0xc0) + 0x80) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"time",&local_159);
    XmlWriter::writeAttribute<double>
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"timestamp",&local_181);
    (anonymous_namespace)::JUnitReporter::JUnitTestCaseData::getCurrentTimestamp_abi_cxx11_();
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (string *)in_stack_fffffffffffffb40);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  if ((*(byte *)(*(long *)(in_RDI + 0xc0) + 0x76) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"doctest_version",&local_1c9);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  }
  local_1d8 = in_RDI + 0x98;
  local_1e0._M_current =
       (JUnitTestCase *)
       std::
       vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
       ::begin((vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
                *)in_stack_fffffffffffffae8);
  local_1e8 = (JUnitTestCase *)
              std::
              vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
              ::end((vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
                     *)in_stack_fffffffffffffae8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>_>
                        *)in_stack_fffffffffffffaf0,
                       (__normal_iterator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>_>
                        *)in_stack_fffffffffffffae8);
    if (!bVar1) break;
    local_211._33_8_ =
         __gnu_cxx::
         __normal_iterator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>_>
         ::operator*(&local_1e0);
    name = (string *)(in_RDI + 8);
    this_00 = (XmlWriter *)local_211;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_211 + 1),"testcase",(allocator *)this_00);
    attribute = XmlWriter::startElement(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"classname",&local_239);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (string *)in_stack_fffffffffffffb40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,"name",(allocator *)(local_289 + 0x28));
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (string *)in_stack_fffffffffffffb40);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)(local_289 + 0x28));
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string((string *)(local_211 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_211);
    if ((*(byte *)(*(long *)(in_RDI + 0xc0) + 0x80) & 1) == 0) {
      in_stack_fffffffffffffb48 = (string *)(in_RDI + 8);
      in_stack_fffffffffffffb50 = (XmlWriter *)local_289;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_289 + 1),"time",(allocator *)in_stack_fffffffffffffb50);
      XmlWriter::writeAttribute<double>
                (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      std::__cxx11::string::~string((string *)(local_289 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_289);
    }
    in_stack_fffffffffffffb40 = &local_2b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,"status",in_stack_fffffffffffffb40);
    XmlWriter::writeAttribute(this_00,name,&attribute->m_tagIsOpen);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    local_2c0 = (vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 *)(local_211._33_8_ + 0x48);
    local_2c8._M_current =
         (JUnitTestMessage *)
         std::
         vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
         ::begin((vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                  *)in_stack_fffffffffffffae8);
    local_2d0 = (JUnitTestMessage *)
                std::
                vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ::end((vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                       *)in_stack_fffffffffffffae8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (__normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
                          *)in_stack_fffffffffffffae8);
      if (!bVar1) break;
      local_2d8 = __gnu_cxx::
                  __normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
                  ::operator*(&local_2c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"failure",(allocator *)(local_329 + 0x28));
      XmlWriter::scopedElement(in_stack_fffffffffffffb18,(string *)in_stack_fffffffffffffb10);
      in_stack_fffffffffffffb20 = (XmlWriter *)local_329;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_329 + 1),"message",(allocator *)in_stack_fffffffffffffb20);
      in_stack_fffffffffffffb18 =
           (XmlWriter *)
           (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                     ((ScopedElement *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffaf0);
      in_stack_fffffffffffffb10 = &local_351;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffcb0,"type",in_stack_fffffffffffffb10);
      (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                ((ScopedElement *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaf0);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                 SUB81((ulong)in_stack_fffffffffffffaf0 >> 0x38,0));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      std::__cxx11::string::~string((string *)(local_329 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_329);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffaf0);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)(local_329 + 0x28));
      __gnu_cxx::
      __normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
      ::operator++(&local_2c8);
    }
    local_360 = (vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 *)(local_211._33_8_ + 0x60);
    local_368._M_current =
         (JUnitTestMessage *)
         std::
         vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
         ::begin((vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                  *)in_stack_fffffffffffffae8);
    local_370 = (JUnitTestMessage *)
                std::
                vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ::end((vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                       *)in_stack_fffffffffffffae8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (__normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
                          *)in_stack_fffffffffffffae8);
      if (!bVar1) break;
      local_378 = __gnu_cxx::
                  __normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
                  ::operator*(&local_368);
      in_stack_fffffffffffffaf8 = (string *)(in_RDI + 8);
      in_stack_fffffffffffffb00 = (allocator *)(local_3c9 + 0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a0,"error",in_stack_fffffffffffffb00);
      XmlWriter::scopedElement(in_stack_fffffffffffffb18,(string *)in_stack_fffffffffffffb10);
      in_stack_fffffffffffffaf0 = (XmlWriter *)local_3c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_3c9 + 1),"message",(allocator *)in_stack_fffffffffffffaf0);
      in_stack_fffffffffffffae8 =
           (string *)
           (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                     ((ScopedElement *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffaf0);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                 SUB81((ulong)in_stack_fffffffffffffaf0 >> 0x38,0));
      std::__cxx11::string::~string((string *)(local_3c9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_3c9);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffaf0);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)(local_3c9 + 0x28));
      __gnu_cxx::
      __normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
      ::operator++(&local_368);
    }
    XmlWriter::endElement(in_stack_fffffffffffffb20);
    __gnu_cxx::
    __normal_iterator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>_>
    ::operator++(&local_1e0);
  }
  XmlWriter::endElement(in_stack_fffffffffffffb20);
  XmlWriter::endElement(in_stack_fffffffffffffb20);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            // remove .exe extension - mainly to have the same output on UNIX and Windows
            std::string binary_name = skipPathFromFilename(opt.binary_name.c_str());
#ifdef DOCTEST_PLATFORM_WINDOWS
            if(binary_name.rfind(".exe") != std::string::npos)
                binary_name = binary_name.substr(0, binary_name.length() - 4);
#endif // DOCTEST_PLATFORM_WINDOWS
            xml.startElement("testsuites");
            xml.startElement("testsuite").writeAttribute("name", binary_name)
                    .writeAttribute("errors", testCaseData.totalErrors)
                    .writeAttribute("failures", testCaseData.totalFailures)
                    .writeAttribute("tests", p.numAsserts);
            if(opt.no_time_in_output == false) {
                xml.writeAttribute("time", testCaseData.totalSeconds);
                xml.writeAttribute("timestamp", JUnitTestCaseData::getCurrentTimestamp());
            }
            if(opt.no_version == false)
                xml.writeAttribute("doctest_version", DOCTEST_VERSION_STR);

            for(const auto& testCase : testCaseData.testcases) {
                xml.startElement("testcase")
                    .writeAttribute("classname", testCase.classname)
                    .writeAttribute("name", testCase.name);
                if(opt.no_time_in_output == false)
                    xml.writeAttribute("time", testCase.time);
                // This is not ideal, but it should be enough to mimic gtest's junit output.
                xml.writeAttribute("status", "run");

                for(const auto& failure : testCase.failures) {
                    xml.scopedElement("failure")
                        .writeAttribute("message", failure.message)
                        .writeAttribute("type", failure.type)
                        .writeText(failure.details, false);
                }

                for(const auto& error : testCase.errors) {
                    xml.scopedElement("error")
                        .writeAttribute("message", error.message)
                        .writeText(error.details);
                }

                xml.endElement();
            }
            xml.endElement();
            xml.endElement();
        }